

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

void __thiscall
pbrt::PortalImageInfiniteLight::PortalImageInfiniteLight
          (PortalImageInfiniteLight *this,Transform *renderFromLight,Image *equiAreaImage,
          RGBColorSpace *imageColorSpace,Float scale,string *filename,
          vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *p,Allocator alloc)

{
  Image *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar3;
  pointer pcVar6;
  Tuple2<pbrt::Point2,_int> TVar7;
  pointer pPVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  _Any_data _Var29;
  ulong uVar30;
  memory_resource *pmVar31;
  Allocator alloc_00;
  allocator_type allocator;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar32;
  _Alloc_hider _Var33;
  long *plVar34;
  ulong uVar35;
  long lVar36;
  long in_FS_OFFSET;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  float fVar42;
  float fVar43;
  MediumInterface MVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar55;
  undefined1 auVar56 [16];
  float fVar57;
  float fVar58;
  float fVar59;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  float local_328;
  float local_2f8;
  float local_2c8;
  size_t vb;
  undefined4 uStack_240;
  undefined1 auStack_238 [16];
  undefined1 local_228 [32];
  long local_208 [2];
  long local_1f8 [12];
  ColorEncodingHandle local_198;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_190;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> local_170;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_150;
  undefined8 *local_128;
  undefined8 uStack_120;
  code *pcStack_118;
  code *pcStack_110;
  Array2D<float> d;
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  long *local_c8 [2];
  long local_b8 [2];
  ImageChannelDesc channelDesc;
  _Any_data local_78;
  code *pcStack_68;
  code *pcStack_60;
  Array2D<float> local_58;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_38;
  
  _uStack_240 = vb;
  (this->super_LightBase).type = Infinite;
  MVar44._0_12_ = ZEXT812(0);
  MVar44.outside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits._4_4_ = 0;
  (this->super_LightBase).mediumInterface = MVar44;
  uVar3 = *(undefined8 *)((renderFromLight->m).m[0] + 2);
  uVar15 = *(undefined8 *)(renderFromLight->m).m[1];
  uVar16 = *(undefined8 *)((renderFromLight->m).m[1] + 2);
  uVar17 = *(undefined8 *)(renderFromLight->m).m[2];
  uVar18 = *(undefined8 *)((renderFromLight->m).m[2] + 2);
  uVar19 = *(undefined8 *)(renderFromLight->m).m[3];
  uVar20 = *(undefined8 *)((renderFromLight->m).m[3] + 2);
  uVar21 = *(undefined8 *)(renderFromLight->mInv).m[0];
  uVar22 = *(undefined8 *)((renderFromLight->mInv).m[0] + 2);
  uVar23 = *(undefined8 *)(renderFromLight->mInv).m[1];
  uVar24 = *(undefined8 *)((renderFromLight->mInv).m[1] + 2);
  uVar25 = *(undefined8 *)(renderFromLight->mInv).m[2];
  uVar26 = *(undefined8 *)((renderFromLight->mInv).m[2] + 2);
  uVar27 = *(undefined8 *)(renderFromLight->mInv).m[3];
  uVar28 = *(undefined8 *)((renderFromLight->mInv).m[3] + 2);
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[0] =
       *(undefined8 *)(renderFromLight->m).m[0];
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[0] + 2) = uVar3;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[1] = uVar15;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[1] + 2) = uVar16;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[2] = uVar17;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[2] + 2) = uVar18;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[3] = uVar19;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[3] + 2) = uVar20;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[0] = uVar21;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[0] + 2) = uVar22;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[1] = uVar23;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[1] + 2) = uVar24;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[2] = uVar25;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[2] + 2) = uVar26;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[3] = uVar27;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[3] + 2) = uVar28;
  *(long *)(in_FS_OFFSET + -0x550) = *(long *)(in_FS_OFFSET + -0x550) + 1;
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  pcVar6 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->filename,pcVar6,pcVar6 + filename->_M_string_length);
  this_00 = &this->image;
  (this->image).format = U256;
  (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x = 0;
  (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y = 0;
  pmVar31 = pstd::pmr::new_delete_resource();
  (this->image).channelNames.alloc.memoryResource = pmVar31;
  (this->image).channelNames.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (this->image).channelNames.nAlloc = 0;
  (this->image).channelNames.nStored = 0;
  (this->image).encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = 0;
  (this->image).p8.alloc.memoryResource = alloc.memoryResource;
  (this->image).p8.ptr = (uchar *)0x0;
  (this->image).p8.nAlloc = 0;
  (this->image).p8.nStored = 0;
  (this->image).p16.alloc.memoryResource = alloc.memoryResource;
  (this->image).p16.ptr = (Half *)0x0;
  (this->image).p16.nAlloc = 0;
  (this->image).p16.nStored = 0;
  (this->image).p32.alloc.memoryResource = alloc.memoryResource;
  (this->image).p32.ptr = (float *)0x0;
  (this->image).p32.nAlloc = 0;
  (this->image).p32.nStored = 0;
  this->imageColorSpace = imageColorSpace;
  this->scale = scale;
  (this->portalFrame).x.super_Tuple3<pbrt::Vector3,_float>.x = 1.0;
  (this->portalFrame).x.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  *(undefined8 *)&(this->portalFrame).x.super_Tuple3<pbrt::Vector3,_float>.z = 0;
  (this->portalFrame).y.super_Tuple3<pbrt::Vector3,_float>.y = 1.0;
  (this->portalFrame).y.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  (this->portalFrame).z.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (this->portalFrame).z.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (this->portalFrame).z.super_Tuple3<pbrt::Vector3,_float>.z = 1.0;
  *(undefined1 (*) [32])&(this->portal).values[1].super_Tuple3<pbrt::Point3,_float>.y =
       ZEXT832(0) << 0x20;
  *(undefined1 (*) [32])(this->portal).values = ZEXT832(0) << 0x20;
  WindowedPiecewiseConstant2D::WindowedPiecewiseConstant2D(&this->distribution,alloc);
  (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  vb = (size_t)auStack_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)&vb,"R","");
  local_228._0_8_ = local_228 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"G","");
  _Var33._M_p = (pointer)local_1f8;
  local_208[0] = (long)_Var33._M_p;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"B","");
  requestedChannels.n = 3;
  requestedChannels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vb;
  Image::GetChannelDesc(&channelDesc,equiAreaImage,requestedChannels);
  lVar36 = -0x60;
  do {
    if ((long *)_Var33._M_p != *(long **)((long)_Var33._M_p + -0x10)) {
      operator_delete(*(long **)((long)_Var33._M_p + -0x10),*(long *)_Var33._M_p + 1);
    }
    _Var33._M_p = _Var33._M_p + -0x20;
    lVar36 = lVar36 + 0x20;
  } while (lVar36 != 0);
  if (channelDesc.offset.nStored == 0) {
    ErrorExit<std::__cxx11::string_const&>
              ("%s: image used for PortalImageInfiniteLight doesn\'t have R, G, B channels.",
               filename);
  }
  d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x = 3;
  vb = channelDesc.offset.nStored;
  if (channelDesc.offset.nStored != 3) {
    LogFatal<char_const(&)[2],char_const(&)[19],char_const(&)[2],int&,char_const(&)[19],unsigned_long&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp"
               ,0x3c6,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [2])0x5d23d2,
               (char (*) [19])"channelDesc.size()",(char (*) [2])0x5d23d2,(int *)&d,
               (char (*) [19])"channelDesc.size()",(unsigned_long *)&vb);
  }
  paVar32 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
             *)channelDesc.offset.ptr;
  if (channelDesc.offset.ptr == (int *)0x0) {
    paVar32 = &channelDesc.offset.field_2;
  }
  if (paVar32->fixed[0] != 0) {
LAB_00381d11:
    LogFatal<char_const(&)[25]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp"
               ,0x3c7,"Check failed: %s",(char (*) [25])"channelDesc.IsIdentity()");
  }
  uVar30 = 1;
  do {
    uVar35 = uVar30;
    if (uVar35 == 3) break;
    uVar30 = uVar35 + 1;
  } while (uVar35 == (long)paVar32->fixed[uVar35]);
  if (uVar35 < 3) goto LAB_00381d11;
  TVar7 = (equiAreaImage->resolution).super_Tuple2<pbrt::Point2,_int>;
  if (TVar7.x != TVar7.y) {
    vb._0_4_ = TVar7.x;
    vb._4_4_ = TVar7.y;
    d.extent.pMin.super_Tuple2<pbrt::Point2,_int> = TVar7;
    ErrorExit<std::__cxx11::string_const&,int,int>
              ("%s: image resolution (%d, %d) is non-square. It\'s unlikely this is an equirect environment map."
               ,filename,(int *)&vb,&d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y);
  }
  lVar36 = (long)(p->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(p->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
  if (lVar36 != 0x30) {
    vb = (lVar36 >> 2) * -0x5555555555555555;
    ErrorExit<unsigned_long>("Expected 4 vertices for infinite light portal but given %d",&vb);
  }
  lVar36 = 0;
  do {
    pPVar8 = (p->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)((long)&(this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.z + lVar36) =
         *(undefined4 *)((long)&(pPVar8->super_Tuple3<pbrt::Point3,_float>).z + lVar36);
    *(undefined8 *)((long)&(this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.x + lVar36) =
         *(undefined8 *)((long)&(pPVar8->super_Tuple3<pbrt::Point3,_float>).x + lVar36);
    lVar36 = lVar36 + 0xc;
  } while (lVar36 != 0x30);
  fVar48 = (this->portal).values[1].super_Tuple3<pbrt::Point3,_float>.x -
           (this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.x;
  uVar1 = (this->portal).values[1].super_Tuple3<pbrt::Point3,_float>.y;
  uVar4 = (this->portal).values[1].super_Tuple3<pbrt::Point3,_float>.z;
  auVar45._4_4_ = uVar4;
  auVar45._0_4_ = uVar1;
  auVar45._8_8_ = 0;
  uVar2 = (this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.y;
  uVar5 = (this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.z;
  auVar49._4_4_ = uVar5;
  auVar49._0_4_ = uVar2;
  auVar49._8_8_ = 0;
  auVar49 = vsubps_avx(auVar45,auVar49);
  auVar45 = vmovshdup_avx(auVar49);
  auVar39 = vfmadd231ss_fma(ZEXT416((uint)(auVar49._0_4_ * auVar49._0_4_)),ZEXT416((uint)fVar48),
                            ZEXT416((uint)fVar48));
  auVar45 = vfmadd231ss_fma(auVar39,auVar45,auVar45);
  if (auVar45._0_4_ < 0.0) {
    fVar43 = sqrtf(auVar45._0_4_);
  }
  else {
    auVar45 = vsqrtss_avx(auVar45,auVar45);
    fVar43 = auVar45._0_4_;
  }
  fVar58 = (this->portal).values[2].super_Tuple3<pbrt::Point3,_float>.x -
           (this->portal).values[1].super_Tuple3<pbrt::Point3,_float>.x;
  fVar59 = (this->portal).values[2].super_Tuple3<pbrt::Point3,_float>.y -
           (this->portal).values[1].super_Tuple3<pbrt::Point3,_float>.y;
  fVar9 = (this->portal).values[2].super_Tuple3<pbrt::Point3,_float>.z -
          (this->portal).values[1].super_Tuple3<pbrt::Point3,_float>.z;
  auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar59 * fVar59)),ZEXT416((uint)fVar58),
                            ZEXT416((uint)fVar58));
  auVar45 = vfmadd231ss_fma(auVar45,ZEXT416((uint)fVar9),ZEXT416((uint)fVar9));
  if (auVar45._0_4_ < 0.0) {
    fVar41 = sqrtf(auVar45._0_4_);
  }
  else {
    auVar45 = vsqrtss_avx(auVar45,auVar45);
    fVar41 = auVar45._0_4_;
  }
  auVar39._4_4_ = fVar43;
  auVar39._0_4_ = fVar43;
  auVar39._8_4_ = fVar43;
  auVar39._12_4_ = fVar43;
  fVar55 = (this->portal).values[2].super_Tuple3<pbrt::Point3,_float>.x -
           (this->portal).values[3].super_Tuple3<pbrt::Point3,_float>.x;
  fVar57 = (this->portal).values[2].super_Tuple3<pbrt::Point3,_float>.y -
           (this->portal).values[3].super_Tuple3<pbrt::Point3,_float>.y;
  fVar10 = (this->portal).values[2].super_Tuple3<pbrt::Point3,_float>.z -
           (this->portal).values[3].super_Tuple3<pbrt::Point3,_float>.z;
  auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar57 * fVar57)),ZEXT416((uint)fVar55),
                            ZEXT416((uint)fVar55));
  auVar45 = vfmadd231ss_fma(auVar45,ZEXT416((uint)fVar10),ZEXT416((uint)fVar10));
  if (auVar45._0_4_ < 0.0) {
    fVar42 = sqrtf(auVar45._0_4_);
  }
  else {
    auVar45 = vsqrtss_avx(auVar45,auVar45);
    fVar42 = auVar45._0_4_;
  }
  auVar50._0_4_ = fVar48 / fVar43;
  auVar50._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar45 = vdivps_avx(auVar49,auVar39);
  fVar55 = fVar55 / fVar42;
  fVar57 = fVar57 / fVar42;
  auVar38 = ZEXT416((uint)(fVar10 / fVar42));
  fVar48 = (this->portal).values[3].super_Tuple3<pbrt::Point3,_float>.y -
           (this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.y;
  auVar49 = vinsertps_avx(*(undefined1 (*) [16])
                           &(this->portal).values[3].super_Tuple3<pbrt::Point3,_float>.z,
                          ZEXT416((uint)(this->portal).values[3].super_Tuple3<pbrt::Point3,_float>.x
                                 ),0x10);
  auVar39 = vinsertps_avx(*(undefined1 (*) [16])
                           &(this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.z,
                          ZEXT416((uint)(this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.x
                                 ),0x10);
  auVar39 = vsubps_avx(auVar49,auVar39);
  auVar49 = vmovshdup_avx(auVar39);
  auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar48 * fVar48)),auVar49,auVar49);
  auVar49 = vfmadd231ss_fma(auVar49,auVar39,auVar39);
  if (auVar49._0_4_ < 0.0) {
    fVar43 = sqrtf(auVar49._0_4_);
  }
  else {
    auVar49 = vsqrtss_avx(auVar49,auVar49);
    fVar43 = auVar49._0_4_;
  }
  fVar58 = fVar58 / fVar41;
  fVar59 = fVar59 / fVar41;
  auVar40._0_4_ = fVar9 / fVar41;
  auVar40._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar51._0_4_ = fVar48 / fVar43;
  auVar46._4_4_ = fVar43;
  auVar46._0_4_ = fVar43;
  auVar46._8_4_ = fVar43;
  auVar46._12_4_ = fVar43;
  auVar49 = vdivps_avx(auVar39,auVar46);
  fVar48 = auVar45._0_4_;
  auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar48 * fVar57)),ZEXT416((uint)fVar55),
                            ZEXT416((uint)auVar50._0_4_));
  auVar39 = vmovshdup_avx(auVar45);
  auVar46 = vfmadd231ss_fma(auVar46,auVar39,auVar38);
  auVar37._8_4_ = 0x7fffffff;
  auVar37._0_8_ = 0x7fffffff7fffffff;
  auVar37._12_4_ = 0x7fffffff;
  auVar37 = vandps_avx512vl(ZEXT416((uint)(auVar46._0_4_ + -1.0)),auVar37);
  auVar46 = vmovshdup_avx(auVar49);
  local_328 = auVar46._0_4_;
  local_2f8 = auVar49._0_4_;
  if (0.001 < auVar37._0_4_) {
LAB_0038165a:
    _uStack_240 = 0;
    vb = (size_t)auStack_238;
    auStack_238._0_8_ = auStack_238._0_8_ & 0xffffffffffffff00;
    detail::stringPrintfRecursive
              ((string *)&vb,"Infinite light portal isn\'t a planar quadrilateral");
    Error((FileLoc *)0x0,(char *)vb);
    if ((undefined1 *)vb != auStack_238) {
      operator_delete((void *)vb,auStack_238._0_8_ + 1);
    }
  }
  else {
    auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar59 * auVar51._0_4_)),ZEXT416((uint)fVar58),
                              ZEXT416((uint)local_328));
    auVar37 = vfmadd231ss_fma(auVar37,auVar40,ZEXT416((uint)local_2f8));
    auVar11._8_4_ = 0x7fffffff;
    auVar11._0_8_ = 0x7fffffff7fffffff;
    auVar11._12_4_ = 0x7fffffff;
    auVar37 = vandps_avx512vl(ZEXT416((uint)(auVar37._0_4_ + -1.0)),auVar11);
    if (0.001 < auVar37._0_4_) goto LAB_0038165a;
  }
  auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar59 * fVar48)),ZEXT416((uint)fVar58),
                            ZEXT416((uint)auVar50._0_4_));
  local_2c8 = auVar39._0_4_;
  auVar37 = vfmadd231ss_fma(auVar37,auVar40,ZEXT416((uint)local_2c8));
  auVar12._8_4_ = 0x7fffffff;
  auVar12._0_8_ = 0x7fffffff7fffffff;
  auVar12._12_4_ = 0x7fffffff;
  auVar37 = vandps_avx512vl(auVar37,auVar12);
  if (auVar37._0_4_ <= 0.001) {
    auVar37 = vfmadd213ss_fma(ZEXT416((uint)fVar58),ZEXT416((uint)fVar55),
                              ZEXT416((uint)(fVar59 * fVar57)));
    auVar37 = vfmadd213ss_fma(auVar40,auVar38,auVar37);
    auVar13._8_4_ = 0x7fffffff;
    auVar13._0_8_ = 0x7fffffff7fffffff;
    auVar13._12_4_ = 0x7fffffff;
    auVar37 = vandps_avx512vl(auVar37,auVar13);
    if (auVar37._0_4_ <= 0.001) {
      auVar37 = vfmadd132ss_fma(ZEXT416((uint)fVar55),ZEXT416((uint)(fVar57 * auVar51._0_4_)),
                                ZEXT416((uint)local_328));
      auVar38 = vfmadd132ss_fma(auVar38,auVar37,ZEXT416((uint)local_2f8));
      auVar14._8_4_ = 0x7fffffff;
      auVar14._0_8_ = 0x7fffffff7fffffff;
      auVar14._12_4_ = 0x7fffffff;
      auVar38 = vandps_avx512vl(auVar38,auVar14);
      if (auVar38._0_4_ <= 0.001) {
        auVar38 = vfmadd231ss_fma(ZEXT416((uint)(auVar51._0_4_ * fVar48)),auVar46,
                                  ZEXT416((uint)auVar50._0_4_));
        auVar39 = vfmadd231ss_fma(auVar38,auVar39,ZEXT416((uint)local_2f8));
        auVar38._8_4_ = 0x7fffffff;
        auVar38._0_8_ = 0x7fffffff7fffffff;
        auVar38._12_4_ = 0x7fffffff;
        auVar39 = vandps_avx512vl(auVar39,auVar38);
        if (auVar39._0_4_ <= 0.001) goto LAB_003817fa;
      }
    }
  }
  _uStack_240 = 0;
  vb = (size_t)auStack_238;
  auStack_238._0_8_ = auStack_238._0_8_ & 0xffffffffffffff00;
  detail::stringPrintfRecursive((string *)&vb,"Infinite light portal isn\'t a planar quadrilateral")
  ;
  Error((FileLoc *)0x0,(char *)vb);
  if ((undefined1 *)vb != auStack_238) {
    operator_delete((void *)vb,auStack_238._0_8_ + 1);
  }
LAB_003817fa:
  auVar39 = vinsertps_avx(auVar50,auVar45,0x1c);
  auVar38 = vshufps_avx(auVar49,auVar49,0xe1);
  auVar37 = vpermt2ps_avx512vl(auVar49,_DAT_005c8630,ZEXT416((uint)auVar51._0_4_));
  auVar40 = vpermi2ps_avx512vl(_DAT_005c8630,auVar45,auVar50);
  auVar51._4_12_ = auVar38._4_12_;
  auVar56._0_4_ = auVar40._0_4_ * auVar51._0_4_;
  auVar56._4_4_ = auVar40._4_4_ * auVar38._4_4_;
  auVar56._8_4_ = auVar40._8_4_ * auVar38._8_4_;
  auVar56._12_4_ = auVar40._12_4_ * auVar38._12_4_;
  auVar49 = vfmsub213ps_fma(auVar45,auVar49,auVar56);
  auVar38 = vfnmadd213ps_fma(auVar40,auVar51,auVar56);
  auVar52._0_4_ = auVar49._0_4_ + auVar38._0_4_;
  auVar52._4_4_ = auVar49._4_4_ + auVar38._4_4_;
  auVar52._8_4_ = auVar49._8_4_ + auVar38._8_4_;
  auVar52._12_4_ = auVar49._12_4_ + auVar38._12_4_;
  auVar49 = vfmsub213ss_fma(ZEXT416((uint)auVar51._0_4_),auVar50,ZEXT416((uint)(fVar48 * local_328))
                           );
  auVar45 = vfnmadd213ss_fma(auVar46,auVar45,ZEXT416((uint)(fVar48 * local_328)));
  uVar3 = vmovlps_avx(auVar39);
  (this->portalFrame).x.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar3;
  (this->portalFrame).x.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar3 >> 0x20);
  (this->portalFrame).x.super_Tuple3<pbrt::Vector3,_float>.z = local_2c8;
  uVar3 = vmovlps_avx(auVar37);
  (this->portalFrame).y.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar3;
  (this->portalFrame).y.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar3 >> 0x20);
  (this->portalFrame).y.super_Tuple3<pbrt::Vector3,_float>.z = local_2f8;
  uVar3 = vmovlps_avx(auVar52);
  (this->portalFrame).z.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar3;
  (this->portalFrame).z.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar3 >> 0x20);
  (this->portalFrame).z.super_Tuple3<pbrt::Vector3,_float>.z = auVar49._0_4_ + auVar45._0_4_;
  TVar7 = (equiAreaImage->resolution).super_Tuple2<pbrt::Point2,_int>;
  d.extent.pMin.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)&d.allocator;
  std::__cxx11::string::_M_construct<char_const*>((string *)&d,"R","");
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"G","");
  plVar34 = local_b8;
  local_c8[0] = plVar34;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"B","");
  local_38.bits =
       (equiAreaImage->encoding).
       super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
       .bits;
  channels.n = 3;
  channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d;
  Image::Image((Image *)&vb,Float,(Point2i)TVar7,channels,(ColorEncodingHandle *)&local_38,alloc);
  _Var29 = _vb;
  (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y = uStack_240;
  this_00->format = (undefined4)vb;
  (this_00->resolution).super_Tuple2<pbrt::Point2,_int>.x = vb._4_4_;
  _vb = _Var29;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->image).channelNames,
              (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_238);
  (this->image).encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (uintptr_t)
         local_198.
         super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
         .bits;
  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
            (&(this->image).p8,&local_190);
  pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
            (&(this->image).p16,&local_170);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
            (&(this->image).p32,&local_150);
  local_150.nStored = 0;
  (*(local_150.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_150.alloc.memoryResource,local_150.ptr,local_150.nAlloc << 2,4);
  local_170.nStored = 0;
  (*(local_170.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_170.alloc.memoryResource,local_170.ptr,local_170.nAlloc * 2,2);
  local_190.nStored = 0;
  (*(local_190.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_190.alloc.memoryResource,local_190.ptr,local_190.nAlloc,1);
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)auStack_238);
  lVar36 = -0x60;
  do {
    if (plVar34 != (long *)plVar34[-2]) {
      operator_delete((long *)plVar34[-2],*plVar34 + 1);
    }
    plVar34 = plVar34 + -4;
    lVar36 = lVar36 + 0x20;
  } while (lVar36 != 0);
  TVar7 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
  local_128 = (undefined8 *)0x0;
  uStack_120 = 0;
  pcStack_118 = (code *)0x0;
  pcStack_110 = (code *)0x0;
  local_128 = (undefined8 *)operator_new(0x18);
  *local_128 = this;
  local_128[1] = renderFromLight;
  local_128[2] = equiAreaImage;
  pcStack_110 = std::
                _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp:998:42)>
                ::_M_invoke;
  pcStack_118 = std::
                _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp:998:42)>
                ::_M_manager;
  _uStack_240 = 0;
  vb = (size_t)&local_128;
  auStack_238._8_8_ =
       std::
       _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:166:29)>
       ::_M_invoke;
  auStack_238._0_8_ =
       std::
       _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:166:29)>
       ::_M_manager;
  ParallelFor(0,(long)TVar7 >> 0x20,(function<void_(long,_long)> *)&vb);
  if ((code *)auStack_238._0_8_ != (code *)0x0) {
    (*(code *)auStack_238._0_8_)(&vb,&vb,3);
  }
  if (pcStack_118 != (code *)0x0) {
    (*pcStack_118)(&local_128,&local_128,3);
  }
  local_78._8_8_ = 0;
  pcStack_60 = std::
               _Function_handler<float_(pbrt::Point2<float>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp:1018:18)>
               ::_M_invoke;
  pcStack_68 = std::
               _Function_handler<float_(pbrt::Point2<float>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp:1018:18)>
               ::_M_manager;
  auVar53._8_4_ = 0x3f800000;
  auVar53._0_8_ = 0x3f8000003f800000;
  auVar53._12_4_ = 0x3f800000;
  _vb = (_Any_data)vmovlhps_avx(ZEXT416(0) << 0x40,auVar53);
  local_78._M_unused._M_object = this;
  alloc_00.memoryResource = pstd::pmr::new_delete_resource();
  Image::GetSamplingDistribution
            (&d,this_00,(function<float_(pbrt::Point2<float>)> *)&local_78,(Bounds2f *)&vb,alloc_00)
  ;
  if (pcStack_68 != (code *)0x0) {
    (*pcStack_68)(&local_78,&local_78,__destroy_functor);
  }
  allocator.memoryResource = pstd::pmr::new_delete_resource();
  auVar47._8_8_ = 0;
  auVar47._0_4_ = d.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x;
  auVar47._4_4_ = d.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y;
  auVar54._8_8_ = 0;
  auVar54._0_4_ = d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
  auVar54._4_4_ = d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
  auVar45 = vpsubd_avx(auVar47,auVar54);
  Array2D<float>::Array2D<float_const*,void>
            (&local_58,d.values,d.values + auVar45._4_4_ * auVar45._0_4_,auVar45._0_4_,auVar45._4_4_
             ,allocator);
  WindowedPiecewiseConstant2D::WindowedPiecewiseConstant2D
            ((WindowedPiecewiseConstant2D *)&vb,&local_58,alloc);
  Array2D<double>::operator=((Array2D<double> *)&this->distribution,(Array2D<double> *)&vb);
  Array2D<float>::operator=(&(this->distribution).func,(Array2D<float> *)local_228);
  Array2D<float>::~Array2D((Array2D<float> *)local_228);
  Array2D<double>::~Array2D((Array2D<double> *)&vb);
  Array2D<float>::~Array2D(&local_58);
  Array2D<float>::~Array2D(&d);
  channelDesc.offset.nStored = 0;
  (*(channelDesc.offset.alloc.memoryResource)->_vptr_memory_resource[3])
            (channelDesc.offset.alloc.memoryResource,channelDesc.offset.ptr,
             channelDesc.offset.nAlloc << 2,4);
  return;
}

Assistant:

PortalImageInfiniteLight::PortalImageInfiniteLight(
    const Transform &renderFromLight, Image equiAreaImage,
    const RGBColorSpace *imageColorSpace, Float scale, const std::string &filename,
    std::vector<Point3f> p, Allocator alloc)
    : LightBase(LightType::Infinite, renderFromLight, MediumInterface()),
      image(alloc),
      imageColorSpace(imageColorSpace),
      scale(scale),
      filename(filename),
      distribution(alloc) {
    // Initialize sampling PDFs for infinite area light
    ImageChannelDesc channelDesc = equiAreaImage.GetChannelDesc({"R", "G", "B"});
    if (!channelDesc)
        ErrorExit("%s: image used for PortalImageInfiniteLight doesn't have R, "
                  "G, B channels.",
                  filename);
    CHECK_EQ(3, channelDesc.size());
    CHECK(channelDesc.IsIdentity());

    if (equiAreaImage.Resolution().x != equiAreaImage.Resolution().y)
        ErrorExit("%s: image resolution (%d, %d) is non-square. It's unlikely "
                  "this is an "
                  "equirect environment map.",
                  filename, equiAreaImage.Resolution().x, equiAreaImage.Resolution().y);

    if (p.size() != 4)
        ErrorExit("Expected 4 vertices for infinite light portal but given %d", p.size());
    for (int i = 0; i < 4; ++i)
        portal[i] = p[i];

    // Compute frame for portal coordinate system
    Vector3f p01 = Normalize(portal[1] - portal[0]);
    Vector3f p12 = Normalize(portal[2] - portal[1]);
    Vector3f p32 = Normalize(portal[2] - portal[3]);
    Vector3f p03 = Normalize(portal[3] - portal[0]);
    // Do opposite edges have the same direction?
    if (std::abs(Dot(p01, p32) - 1) > .001 || std::abs(Dot(p12, p03) - 1) > .001)
        Error("Infinite light portal isn't a planar quadrilateral");
    // Sides perpendicular?
    if (std::abs(Dot(p01, p12)) > .001 || std::abs(Dot(p12, p32)) > .001 ||
        std::abs(Dot(p32, p03)) > .001 || std::abs(Dot(p03, p01)) > .001)
        Error("Infinite light portal isn't a planar quadrilateral");
    portalFrame = Frame::FromXY(p01, p03);

    // Resample environment map into rectified coordinates
    // Resample the latlong map into rectified coordinates
    image = Image(PixelFormat::Float, equiAreaImage.Resolution(), {"R", "G", "B"},
                  equiAreaImage.Encoding(), alloc);
    ParallelFor(0, image.Resolution().y, [&](int y) {
        for (int x = 0; x < image.Resolution().x; ++x) {
            // [0,1]^2 image coordinates
            Point2f st((x + 0.5f) / image.Resolution().x,
                       (y + 0.5f) / image.Resolution().y);

            Vector3f w = RenderFromImage(st);

            w = Normalize(renderFromLight.ApplyInverse(w));

            WrapMode2D equiAreaWrap(WrapMode::OctahedralSphere,
                                    WrapMode::OctahedralSphere);
            Point2f stEqui = EqualAreaSphereToSquare(w);
            for (int c = 0; c < 3; ++c)
                image.SetChannel({x, y}, c,
                                 equiAreaImage.BilerpChannel(stEqui, c, equiAreaWrap));
        }
    });

    // Initialize sampling PDFs for infinite area light
    auto duvdw = [&](const Point2f &p) {
        Float duv_dw;
        (void)RenderFromImage(p, &duv_dw);
        return duv_dw;
    };
    Array2D<Float> d = image.GetSamplingDistribution(duvdw);
    distribution = WindowedPiecewiseConstant2D(d, alloc);
}